

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O3

void __thiscall FTextureManager::UpdateAnimations(FTextureManager *this,DWORD mstime)

{
  WORD *pWVar1;
  WORD WVar2;
  int iVar3;
  FAnimDef *this_00;
  ulong uVar4;
  ushort uVar5;
  FTextureID FVar6;
  FTextureID FVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  
  if ((this->mAnimations).Count != 0) {
    uVar9 = 0;
    do {
      this_00 = (this->mAnimations).Array[uVar9];
      uVar10 = this_00->SwitchTime;
      if (uVar10 == 0) {
        FAnimDef::SetSwitchTime(this_00,mstime);
      }
      else {
        while (uVar10 <= mstime) {
          switch(this_00->AnimType) {
          case '\x01':
            WVar2 = this_00->CurFrame;
            if (WVar2 == 0) {
              WVar2 = this_00->NumFrames;
            }
            this_00->CurFrame = WVar2 - 1;
            break;
          case '\x02':
            uVar5 = this_00->CurFrame + 1;
            this_00->CurFrame = uVar5;
            if ((int)(this_00->NumFrames - 1) <= (int)(uint)uVar5) {
              this_00->AnimType = '\x03';
            }
            break;
          case '\x03':
            pWVar1 = &this_00->CurFrame;
            *pWVar1 = *pWVar1 - 1;
            if (*pWVar1 == 0) {
              this_00->AnimType = '\x02';
            }
            break;
          case '\x04':
            uVar5 = this_00->NumFrames;
            if (1 < uVar5) {
              uVar10 = FRandom::GenRand32(&pr_animatepictures);
              uVar4 = (ulong)uVar10 % (ulong)(uVar5 - 1);
              WVar2 = ((short)uVar4 + 1) - (ushort)((uint)uVar4 < (uint)this_00->CurFrame);
              goto LAB_00636e68;
            }
            break;
          default:
            WVar2 = (WORD)((this_00->CurFrame + 1) % (uint)this_00->NumFrames);
LAB_00636e68:
            this_00->CurFrame = WVar2;
          }
          FAnimDef::SetSwitchTime(this_00,mstime);
          uVar10 = this_00->SwitchTime;
        }
      }
      if (this_00->bDiscrete == false) {
        if (this_00->NumFrames != 0) {
          uVar10 = 0;
          do {
            FVar6 = FTextureID::operator+(&this_00->BasePic,uVar10);
            FVar7 = FTextureID::operator+
                              (&this_00->BasePic,
                               (this_00->CurFrame + uVar10) % (uint)this_00->NumFrames);
            if ((ulong)(long)FVar6.texnum < (ulong)(this->Translation).Count) {
              if ((ulong)(this->Textures).Count <= (ulong)(long)FVar7.texnum) {
                FVar7 = FVar6;
              }
              (this->Translation).Array[FVar6.texnum] = FVar7.texnum;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < this_00->NumFrames);
        }
      }
      else {
        iVar3 = (this_00->BasePic).texnum;
        if ((ulong)(long)iVar3 < (ulong)(this->Translation).Count) {
          iVar8 = this_00->Frames[this_00->CurFrame].FramePic.texnum;
          if ((ulong)(this->Textures).Count <= (ulong)(long)iVar8) {
            iVar8 = iVar3;
          }
          (this->Translation).Array[iVar3] = iVar8;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->mAnimations).Count);
  }
  return;
}

Assistant:

void FTextureManager::UpdateAnimations (DWORD mstime)
{
	for (unsigned int j = 0; j < mAnimations.Size(); ++j)
	{
		FAnimDef *anim = mAnimations[j];

		// If this is the first time through R_UpdateAnimations, just
		// initialize the anim's switch time without actually animating.
		if (anim->SwitchTime == 0)
		{
			anim->SetSwitchTime (mstime);
		}
		else while (anim->SwitchTime <= mstime)
		{ // Multiple frames may have passed since the last time calling
		  // R_UpdateAnimations, so be sure to loop through them all.

			switch (anim->AnimType)
			{
			default:
			case FAnimDef::ANIM_Forward:
				anim->CurFrame = (anim->CurFrame + 1) % anim->NumFrames;
				break;

			case FAnimDef::ANIM_Backward:
				if (anim->CurFrame == 0)
				{
					anim->CurFrame = anim->NumFrames - 1;
				}
				else
				{
					anim->CurFrame -= 1;
				}
				break;

			case FAnimDef::ANIM_Random:
				// select a random frame other than the current one
				if (anim->NumFrames > 1)
				{
					WORD rndFrame = (WORD)pr_animatepictures(anim->NumFrames - 1);
					if (rndFrame >= anim->CurFrame) rndFrame++;
					anim->CurFrame = rndFrame;
				}
				break;

			case FAnimDef::ANIM_OscillateUp:
				anim->CurFrame = anim->CurFrame + 1;
				if (anim->CurFrame >= anim->NumFrames - 1)
				{
					anim->AnimType = FAnimDef::ANIM_OscillateDown;
				}
				break;

			case FAnimDef::ANIM_OscillateDown:
				anim->CurFrame = anim->CurFrame - 1;
				if (anim->CurFrame == 0)
				{
					anim->AnimType = FAnimDef::ANIM_OscillateUp;
				}
				break;
			}
			anim->SetSwitchTime (mstime);
		}

		if (anim->bDiscrete)
		{
			SetTranslation (anim->BasePic, anim->Frames[anim->CurFrame].FramePic);
		}
		else
		{
			for (unsigned int i = 0; i < anim->NumFrames; i++)
			{
				SetTranslation (anim->BasePic + i, anim->BasePic + (i + anim->CurFrame) % anim->NumFrames);
			}
		}
	}
}